

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
hufDecode(uint64_t *hcode,HufDec *hdecod,uint8_t *in,uint64_t ni,uint32_t rlc,uint64_t no,
         uint16_t *out)

{
  undefined2 uVar1;
  long lVar2;
  undefined2 *puVar3;
  int iVar4;
  undefined2 *puVar5;
  byte *pbVar6;
  int *piVar7;
  uint64_t uVar8;
  ulong uVar9;
  long in_RCX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  undefined2 *in_stack_00000008;
  uint16_t s_2;
  uint8_t cs_2;
  HufDec *pl_1;
  uint64_t decoffset_1;
  uint64_t i;
  uint16_t s_1;
  uint8_t cs_1;
  int l;
  uint32_t *decbuf;
  uint32_t j;
  uint16_t s;
  uint8_t cs;
  HufDec *pl;
  uint64_t decoffset;
  uint8_t *ie;
  uint16_t *oe;
  uint16_t *outb;
  int lc;
  uint64_t c;
  byte local_a1;
  byte local_85;
  uint local_78;
  byte local_71;
  int local_44;
  ulong local_40;
  byte *local_20;
  uint local_4;
  
  puVar3 = in_stack_00000008;
  local_40 = 0;
  local_44 = 0;
  puVar5 = in_stack_00000008 + in_R9;
  pbVar6 = in_RDX + (in_RCX + 7U >> 3);
  local_20 = in_RDX;
  do {
    if (pbVar6 <= local_20) {
      uVar9 = 8U - in_RCX & 7;
      local_40 = local_40 >> (sbyte)uVar9;
      local_44 = local_44 - (int)uVar9;
      while( true ) {
        while( true ) {
          if (local_44 < 1) {
            local_4 = (uint)(in_stack_00000008 != puVar5);
            return local_4;
          }
          piVar7 = (int *)(in_RSI + (local_40 << (0xeU - (char)local_44 & 0x3f) & 0x3fff) * 0x10);
          if (*piVar7 == 0) {
            return 0x17;
          }
          if (local_44 < *piVar7) {
            return 0x17;
          }
          local_44 = local_44 - *piVar7;
          if (piVar7[1] == in_R8D) break;
          if (puVar5 <= in_stack_00000008) {
            return 0x17;
          }
          *in_stack_00000008 = (short)piVar7[1];
          in_stack_00000008 = in_stack_00000008 + 1;
        }
        if (local_44 < 8) {
          if (pbVar6 <= local_20) {
            return 1;
          }
          local_40 = local_40 << 8 | (ulong)*local_20;
          local_44 = local_44 + 8;
          local_20 = local_20 + 1;
        }
        local_44 = local_44 + -8;
        local_a1 = (byte)(local_40 >> ((byte)local_44 & 0x3f));
        if (puVar5 < in_stack_00000008 + (int)(uint)local_a1) break;
        if (in_stack_00000008 + -1 < puVar3) {
          return 1;
        }
        uVar1 = in_stack_00000008[-1];
        while (local_a1 != 0) {
          *in_stack_00000008 = uVar1;
          in_stack_00000008 = in_stack_00000008 + 1;
          local_a1 = local_a1 - 1;
        }
      }
      return 0x17;
    }
    local_40 = local_40 << 8 | (ulong)*local_20;
    local_44 = local_44 + 8;
    local_20 = local_20 + 1;
    while (0xd < local_44) {
      piVar7 = (int *)(in_RSI + (local_40 >> ((char)local_44 - 0xeU & 0x3f) & 0x3fff) * 0x10);
      if (*piVar7 == 0) {
        lVar2 = *(long *)(piVar7 + 2);
        if (*(long *)(piVar7 + 2) == 0) {
          return 0x17;
        }
        for (local_78 = 0; local_78 < (uint)piVar7[1]; local_78 = local_78 + 1) {
          iVar4 = hufLength(*(uint64_t *)
                             (in_RDI + (ulong)*(uint *)(lVar2 + (ulong)local_78 * 4) * 8));
          for (; local_44 < iVar4 && local_20 < pbVar6; local_44 = local_44 + 8) {
            local_40 = local_40 << 8 | (ulong)*local_20;
            local_20 = local_20 + 1;
          }
          if ((iVar4 <= local_44) &&
             (uVar8 = hufCode(*(uint64_t *)
                               (in_RDI + (ulong)*(uint *)(lVar2 + (ulong)local_78 * 4) * 8)),
             uVar8 == (local_40 >> ((char)local_44 - (byte)iVar4 & 0x3f) &
                      (1L << ((byte)iVar4 & 0x3f)) - 1U))) {
            local_44 = local_44 - iVar4;
            if (*(int *)(lVar2 + (ulong)local_78 * 4) == in_R8D) {
              if (local_44 < 8) {
                if (pbVar6 <= local_20) {
                  return 1;
                }
                local_40 = local_40 << 8 | (ulong)*local_20;
                local_44 = local_44 + 8;
                local_20 = local_20 + 1;
              }
              local_44 = local_44 + -8;
              local_85 = (byte)(local_40 >> ((byte)local_44 & 0x3f));
              if (puVar5 < in_stack_00000008 + (int)(uint)local_85) {
                return 0x17;
              }
              if (in_stack_00000008 + -1 < puVar3) {
                return 1;
              }
              uVar1 = in_stack_00000008[-1];
              while (local_85 != 0) {
                *in_stack_00000008 = uVar1;
                in_stack_00000008 = in_stack_00000008 + 1;
                local_85 = local_85 - 1;
              }
            }
            else {
              if (puVar5 <= in_stack_00000008) {
                return 0x17;
              }
              *in_stack_00000008 = (short)*(undefined4 *)(lVar2 + (ulong)local_78 * 4);
              in_stack_00000008 = in_stack_00000008 + 1;
            }
            break;
          }
        }
        if (local_78 == piVar7[1]) {
          return 0x17;
        }
      }
      else {
        if (local_44 < *piVar7) {
          return 0x17;
        }
        local_44 = local_44 - *piVar7;
        if (piVar7[1] == in_R8D) {
          if (local_44 < 8) {
            if (pbVar6 <= local_20) {
              return 1;
            }
            local_40 = local_40 << 8 | (ulong)*local_20;
            local_44 = local_44 + 8;
            local_20 = local_20 + 1;
          }
          local_44 = local_44 + -8;
          local_71 = (byte)(local_40 >> ((byte)local_44 & 0x3f));
          if (puVar5 < in_stack_00000008 + (int)(uint)local_71) {
            return 0x17;
          }
          if (in_stack_00000008 + -1 < puVar3) {
            return 1;
          }
          uVar1 = in_stack_00000008[-1];
          while (local_71 != 0) {
            *in_stack_00000008 = uVar1;
            in_stack_00000008 = in_stack_00000008 + 1;
            local_71 = local_71 - 1;
          }
        }
        else {
          if (puVar5 <= in_stack_00000008) {
            return 0x17;
          }
          *in_stack_00000008 = (short)piVar7[1];
          in_stack_00000008 = in_stack_00000008 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

static exr_result_t
hufDecode (
    const uint64_t* hcode,  // i : encoding table
    const HufDec*   hdecod, // i : decoding table
    const uint8_t*  in,     // i : compressed input buffer
    uint64_t        ni,     // i : input size (in bits)
    uint32_t        rlc,    // i : run-length code
    uint64_t        no,     // i : expected output size (count of uint16 items)
    uint16_t*       out)
{
    uint64_t       c    = 0;
    int            lc   = 0;
    uint16_t*      outb = out;
    uint16_t*      oe   = out + no;
    const uint8_t* ie   = in + (ni + 7) / 8; // input byte size

    //
    // Loop on input bytes
    //

    while (in < ie)
    {
        getChar (c, lc, in);

        //
        // Access decoding table
        //

        while (lc >= HUF_DECBITS)
        {
            uint64_t      decoffset = (c >> (lc - HUF_DECBITS)) & HUF_DECMASK;
            const HufDec* pl        = hdecod + decoffset;

            if (pl->len)
            {
                //
                // Get short code
                //

                if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;

                lc -= pl->len;
                getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
            }
            else
            {
                uint32_t        j;
                const uint32_t* decbuf = pl->p;
                if (!pl->p) return EXR_ERR_CORRUPT_CHUNK; // wrong code

                //
                // Search long code
                //

                for (j = 0; j < pl->lit; j++)
                {
                    int l = hufLength (hcode[decbuf[j]]);

                    while (lc < l && in < ie) // get more bits
                    {
                        getChar (c, lc, in);
                    }

                    if (lc >= l)
                    {
                        if (hufCode (hcode[decbuf[j]]) ==
                            ((c >> (lc - l)) & (((uint64_t) (1) << l) - 1)))
                        {
                            //
                            // Found : get long code
                            //

                            lc -= l;
                            getCode (
                                decbuf[j], rlc, c, lc, in, ie, out, outb, oe);
                            break;
                        }
                    }
                }

                if (j == pl->lit) return EXR_ERR_CORRUPT_CHUNK;
            }
        }
    }

    //
    // Get remaining (short) codes
    //

    uint64_t i = (8 - ni) & 7;
    c >>= i;
    lc -= i;

    while (lc > 0)
    {
        uint64_t      decoffset = (c << (HUF_DECBITS - lc)) & HUF_DECMASK;
        const HufDec* pl        = hdecod + decoffset;

        if (pl->len)
        {
            if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;
            lc -= pl->len;
            getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
        }
        else
            return EXR_ERR_CORRUPT_CHUNK;
    }

    if (out != oe) return EXR_ERR_OUT_OF_MEMORY;
    return EXR_ERR_SUCCESS;
}